

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void sphere_of_plasma_end(CHAR_DATA *ch,AFFECT_DATA *paf)

{
  AFFECT_DATA af;
  AFFECT_DATA AStack_78;
  
  if (paf->aftype == 7) {
    send_to_char("You feel ready to create another sphere of plasma.\n\r",ch);
    return;
  }
  act("The sphere of plasma encasing you dissipates.",ch,(void *)0x0,(void *)0x0,3);
  init_affect(&AStack_78);
  AStack_78.where = 0;
  AStack_78.aftype = 7;
  AStack_78.type = gsn_sphere_of_plasma;
  AStack_78.level = ch->level;
  AStack_78.location = 0;
  AStack_78.modifier = 0;
  AStack_78.duration = AStack_78.level / 5;
  affect_to_char(ch,&AStack_78);
  return;
}

Assistant:

void sphere_of_plasma_end(CHAR_DATA *ch, AFFECT_DATA *paf)
{
	AFFECT_DATA af;

	if (paf->aftype == AFT_TIMER)
	{
		send_to_char("You feel ready to create another sphere of plasma.\n\r", ch);
		return;
	}

	act("The sphere of plasma encasing you dissipates.", ch, nullptr, nullptr, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = gsn_sphere_of_plasma;
	af.level = ch->level;
	af.location = 0;
	af.modifier = 0;
	af.duration = ch->level / 5;
	affect_to_char(ch, &af);
}